

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O3

void QPDFObjectHandle::parseContentStream_data
               (shared_ptr<Buffer> *stream_data,string *description,ParserCallbacks *callbacks,
               QPDF *context)

{
  pointer *ppQVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  pointer i;
  qpdf_offset_t qVar5;
  qpdf_offset_t qVar6;
  type ii;
  size_t __nbytes;
  long i_00;
  type ii_1;
  char ch;
  QPDFObjectHandle obj;
  shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>_>
  sp_description;
  Tokenizer tokenizer;
  BufferInputSource input;
  undefined1 local_2f1;
  string *local_2f0;
  undefined1 local_2e8 [32];
  string local_2c8;
  InputSource *local_2a8;
  pointer local_2a0;
  shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>_>
  local_298;
  undefined1 local_288 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  undefined1 local_258 [32];
  undefined1 local_238 [16];
  undefined1 local_228 [128];
  uint local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150 [3];
  BufferInputSource local_118;
  
  local_2e8._16_8_ = callbacks;
  local_2e8._24_8_ = context;
  local_258._24_8_ =
       Buffer::getSize((stream_data->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
  ;
  local_2f0 = description;
  BufferInputSource::BufferInputSource
            (&local_118,description,
             (stream_data->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,false);
  ::qpdf::Tokenizer::Tokenizer((Tokenizer *)(local_228 + 0x78));
  ::qpdf::Tokenizer::allowEOF((Tokenizer *)(local_228 + 0x78));
  local_238._0_8_ = local_228;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"content","");
  QPDFParser::make_description((QPDFParser *)local_288,local_2f0,(string *)local_238);
  if ((pointer)local_238._0_8_ != (pointer)local_228) {
    operator_delete((void *)local_238._0_8_,(ulong)(local_228._0_8_ + 1));
  }
  do {
    i = (pointer)BufferInputSource::tell(&local_118);
    if ((long)i < 0) {
      QIntC::IntConverter<long_long,_unsigned_long,_true,_false>::error((longlong)i);
    }
    if ((ulong)local_258._24_8_ <= i) break;
    local_238._0_8_ = local_228;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"content","");
    ::qpdf::Tokenizer::nextToken
              ((Tokenizer *)(local_228 + 0x78),&local_118.super_InputSource,(string *)local_238,1);
    if ((pointer)local_238._0_8_ != (pointer)local_228) {
      operator_delete((void *)local_238._0_8_,(ulong)(local_228._0_8_ + 1));
    }
    qVar5 = InputSource::getLastOffset(&local_118.super_InputSource);
    BufferInputSource::seek(&local_118,qVar5,0);
    local_298.
    super___shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)local_288._0_8_;
    local_298.
    super___shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_;
    if ((pointer)local_288._8_8_ != (pointer)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ppQVar1 = &(((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_288._8_8_)
                   ->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        *(int *)ppQVar1 = *(int *)ppQVar1 + 1;
        UNLOCK();
      }
      else {
        ppQVar1 = &(((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_288._8_8_)
                   ->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        *(int *)ppQVar1 = *(int *)ppQVar1 + 1;
      }
    }
    QPDFParser::parse_content
              ((QPDFParser *)local_2e8,&local_118.super_InputSource,&local_298,
               (Tokenizer *)(local_228 + 0x78),(QPDF *)local_2e8._24_8_);
    if ((pointer)local_298.
                 super___shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_298.
                 super___shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    uVar2 = local_2e8._0_8_;
    if ((InputSource *)local_2e8._0_8_ != (InputSource *)0x0) {
      qVar6 = BufferInputSource::tell(&local_118);
      __nbytes = qVar6 - qVar5;
      if ((long)__nbytes < 0) {
        QIntC::IntConverter<long_long,_unsigned_long,_true,_false>::error(__nbytes);
      }
      local_2a8 = (InputSource *)local_2e8._0_8_;
      local_2a0 = (pointer)local_2e8._8_8_;
      if ((pointer)local_2e8._8_8_ != (pointer)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(local_2e8._8_8_ + 8) = *(int *)(local_2e8._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(int *)(local_2e8._8_8_ + 8) = *(int *)(local_2e8._8_8_ + 8) + 1;
        }
      }
      if (qVar5 < 0) {
        QIntC::IntConverter<long_long,_unsigned_long,_true,_false>::error(qVar5);
      }
      (*(*(_func_int ***)local_2e8._16_8_)[3])(local_2e8._16_8_,&local_2a8,qVar5);
      if (local_2a0 != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a0);
      }
      bVar3 = isOperator((QPDFObjectHandle *)local_2e8);
      if (bVar3) {
        getOperatorValue_abi_cxx11_((string *)local_238,(QPDFObjectHandle *)local_2e8);
        iVar4 = std::__cxx11::string::compare((char *)local_238);
        if ((pointer)local_238._0_8_ != (pointer)local_228) {
          operator_delete((void *)local_238._0_8_,(ulong)(local_228._0_8_ + 1));
        }
        if (iVar4 == 0) {
          BufferInputSource::read(&local_118,(int)&local_2f1,(void *)0x1,__nbytes);
          ::qpdf::Tokenizer::expectInlineImage
                    ((Tokenizer *)(local_228 + 0x78),&local_118.super_InputSource);
          ::qpdf::Tokenizer::nextToken
                    ((Tokenizer *)(local_228 + 0x78),&local_118.super_InputSource,local_2f0,0);
          qVar5 = InputSource::getLastOffset(&local_118.super_InputSource);
          qVar6 = BufferInputSource::tell(&local_118);
          i_00 = qVar6 - qVar5;
          if (i_00 < 0) {
            QIntC::IntConverter<long_long,_unsigned_long,_true,_false>::error(i_00);
          }
          if (local_1a8 == 0) {
            local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)(local_2e8 + 0x20),"stream data","");
            qVar5 = BufferInputSource::tell(&local_118);
            local_288._16_8_ = &local_268;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)(local_288 + 0x10),"EOF found while reading inline image","");
            QPDFExc::QPDFExc((QPDFExc *)local_238,qpdf_e_damaged_pdf,local_2f0,
                             (string *)(local_2e8 + 0x20),qVar5,(string *)(local_288 + 0x10));
            warn((QPDF *)local_2e8._24_8_,(QPDFExc *)local_238);
            QPDFExc::~QPDFExc((QPDFExc *)local_238);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_288._16_8_ != &local_268) {
              operator_delete((void *)local_288._16_8_,(ulong)(local_268._M_allocated_capacity + 1))
              ;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
              operator_delete(local_2c8._M_dataplus._M_p,
                              (ulong)(local_2c8.field_2._M_allocated_capacity + 1));
            }
          }
          else {
            QPDFObject::create<QPDF_InlineImage,std::__cxx11::string_const&>
                      ((QPDFObject *)local_238,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (&local_1a0._M_allocated_capacity +
                       (ulong)((local_1a8 & 0xfffffffd) != 8) * 4));
            local_258._0_4_ = local_238._0_4_;
            local_258._4_4_ = local_238._4_4_;
            local_258._8_4_ = local_238._8_4_;
            local_258._12_4_ = local_238._12_4_;
            if (qVar5 < 0) {
              QIntC::IntConverter<long_long,_unsigned_long,_true,_false>::error(qVar5);
            }
            (*(*(_func_int ***)local_2e8._16_8_)[3])(local_2e8._16_8_,local_258,qVar5,i_00);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                CONCAT44(local_258._12_4_,local_258._8_4_) !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         CONCAT44(local_258._12_4_,local_258._8_4_));
            }
          }
        }
      }
    }
    if ((pointer)local_2e8._8_8_ != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e8._8_8_);
    }
  } while ((InputSource *)uVar2 != (InputSource *)0x0);
  if ((pointer)local_288._8_8_ != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_);
  }
  if (local_160 != local_150) {
    operator_delete(local_160,local_150[0]._M_allocated_capacity + 1);
  }
  if (local_180 != &local_170) {
    operator_delete(local_180,local_170._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_allocated_capacity != &local_190) {
    operator_delete((void *)local_1a0._M_allocated_capacity,local_190._M_allocated_capacity + 1);
  }
  BufferInputSource::~BufferInputSource(&local_118);
  return;
}

Assistant:

void
QPDFObjectHandle::parseContentStream_data(
    std::shared_ptr<Buffer> stream_data,
    std::string const& description,
    ParserCallbacks* callbacks,
    QPDF* context)
{
    size_t stream_length = stream_data->getSize();
    auto input = BufferInputSource(description, stream_data.get());
    Tokenizer tokenizer;
    tokenizer.allowEOF();
    auto sp_description = QPDFParser::make_description(description, "content");
    while (QIntC::to_size(input.tell()) < stream_length) {
        // Read a token and seek to the beginning. The offset we get from this process is the
        // beginning of the next non-ignorable (space, comment) token. This way, the offset and
        // don't including ignorable content.
        tokenizer.nextToken(input, "content", true);
        qpdf_offset_t offset = input.getLastOffset();
        input.seek(offset, SEEK_SET);
        auto obj = QPDFParser::parse_content(input, sp_description, tokenizer, context);
        if (!obj) {
            // EOF
            break;
        }
        size_t length = QIntC::to_size(input.tell() - offset);

        callbacks->handleObject(obj, QIntC::to_size(offset), length);
        if (obj.isOperator() && (obj.getOperatorValue() == "ID")) {
            // Discard next character; it is the space after ID that terminated the token.  Read
            // until end of inline image.
            char ch;
            input.read(&ch, 1);
            tokenizer.expectInlineImage(input);
            tokenizer.nextToken(input, description);
            offset = input.getLastOffset();
            length = QIntC::to_size(input.tell() - offset);
            if (tokenizer.getType() == QPDFTokenizer::tt_bad) {
                QTC::TC("qpdf", "QPDFObjectHandle EOF in inline image");
                warn(
                    context,
                    QPDFExc(
                        qpdf_e_damaged_pdf,
                        description,
                        "stream data",
                        input.tell(),
                        "EOF found while reading inline image"));
            } else {
                QTC::TC("qpdf", "QPDFObjectHandle inline image token");
                callbacks->handleObject(
                    QPDFObjectHandle::newInlineImage(tokenizer.getValue()),
                    QIntC::to_size(offset),
                    length);
            }
        }
    }
}